

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_nls.c
# Opt level: O0

int IDASetNlsResFn(void *ida_mem,IDAResFn res)

{
  long in_RSI;
  long in_RDI;
  IDAMem IDA_mem;
  int local_4;
  
  if (in_RDI == 0) {
    IDAProcessError((IDAMem)0x0,-0x14,0x8f,"IDASetNlsResFn",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas_nls.c"
                    ,"ida_mem = NULL illegal.");
    local_4 = -0x14;
  }
  else {
    if (in_RSI == 0) {
      *(undefined8 *)(in_RDI + 0x730) = *(undefined8 *)(in_RDI + 0x10);
    }
    else {
      *(long *)(in_RDI + 0x730) = in_RSI;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int IDASetNlsResFn(void* ida_mem, IDAResFn res)
{
  IDAMem IDA_mem;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }

  IDA_mem = (IDAMem)ida_mem;

  if (res) { IDA_mem->nls_res = res; }
  else { IDA_mem->nls_res = IDA_mem->ida_res; }

  return (IDA_SUCCESS);
}